

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

VisitReturn __thiscall
QMakeEvaluator::visitProLoop(QMakeEvaluator *this,ProKey *_variable,ushort *exprPtr,ushort *tokPtr)

{
  bool bVar1;
  bool bVar2;
  VisitReturn VVar3;
  int iVar4;
  int iVar5;
  qsizetype qVar6;
  char *pcVar7;
  ProString *in_RSI;
  QMakeEvaluator *in_RDI;
  long in_FS_OFFSET;
  QStringView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  int i_1;
  int i;
  int absDiff;
  int end;
  int start;
  int dotdot;
  int index;
  bool infinite;
  VisitReturn ret;
  ProString val;
  bool ok;
  QStringView itl;
  ProStringList list;
  ProString it_list;
  ProStringList it_list_out;
  ProStringList oldVarVal;
  ProKey variable;
  undefined4 in_stack_fffffffffffffb38;
  CaseSensitivity in_stack_fffffffffffffb3c;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  VisitReturn in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  QMakeEvaluator *in_stack_fffffffffffffb50;
  ProString *in_stack_fffffffffffffb58;
  ProString *in_stack_fffffffffffffb60;
  undefined1 *n;
  QMakeEvaluator *in_stack_fffffffffffffb68;
  ProString *in_stack_fffffffffffffb70;
  storage_type_conflict *in_stack_fffffffffffffb78;
  int local_468;
  int local_464;
  int local_450;
  uint local_44c;
  VisitReturn local_444;
  VisitReturn local_424;
  qsizetype local_418;
  storage_type_conflict *local_410;
  qsizetype local_3e8;
  storage_type_conflict *local_3e0;
  QMakeEvaluator *in_stack_fffffffffffffc68;
  ProString local_370;
  storage_type *local_340;
  undefined1 local_330 [24];
  undefined1 local_318 [96];
  QString local_2b8 [2];
  qsizetype local_288;
  storage_type_conflict *local_280;
  qsizetype local_260;
  storage_type_conflict *local_258;
  undefined1 local_238 [72];
  undefined1 local_1f0 [76];
  int local_1a4;
  QStringView local_1a0;
  QStringView local_190;
  byte local_179;
  qsizetype local_168;
  storage_type_conflict *psStack_160;
  QList<ProString> local_158 [4];
  storage_type *local_f8;
  undefined1 local_e8 [24];
  undefined1 local_d0 [48];
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  ushort *tokPtr_00;
  ProString local_70;
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_444 = ReturnTrue;
  bVar2 = false;
  local_44c = 0;
  memset(&local_70,0xaa,0x30);
  ProString::ProString((ProString *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
  tokPtr_00 = (ushort *)0xaaaaaaaaaaaaaaaa;
  ProStringList::ProStringList((ProStringList *)0x2f50a2);
  local_a0 = 0xaaaaaaaaaaaaaaaa;
  local_98 = 0xaaaaaaaaaaaaaaaa;
  local_90 = 0xaaaaaaaaaaaaaaaa;
  ProStringList::ProStringList((ProStringList *)0x2f50dc);
  VVar3 = expandVariableReferences
                    (in_stack_fffffffffffffb68,(ushort **)in_stack_fffffffffffffb60,
                     (int)((ulong)in_stack_fffffffffffffb58 >> 0x20),
                     (ProStringList *)in_stack_fffffffffffffb50,
                     SUB41((uint)in_stack_fffffffffffffb4c >> 0x18,0));
  if (VVar3 == ReturnError) {
    local_424 = ReturnError;
    goto LAB_002f5c00;
  }
  memset(local_d0,0xaa,0x30);
  QList<ProString>::at
            ((QList<ProString> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
             CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  ProString::ProString
            ((ProString *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
             (ProString *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  bVar1 = ProString::isEmpty(in_RSI);
  if (bVar1) {
    bVar1 = ProString::operator!=
                      ((ProString *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                       (QString *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    if (!bVar1) {
      ProString::ProString
                ((ProString *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 (QString *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      ProString::operator=
                ((ProString *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 (ProString *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      ProString::~ProString((ProString *)0x2f522f);
      goto LAB_002f528f;
    }
    QByteArrayView::QByteArrayView<25ul>
              ((QByteArrayView *)in_stack_fffffffffffffb50,
               (char (*) [25])CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    QVar9.m_data = local_f8;
    QVar9.m_size = (qsizetype)local_e8;
    QString::fromLatin1(QVar9);
    evalError((QMakeEvaluator *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
              (QString *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    QString::~QString((QString *)0x2f51da);
    local_424 = ReturnFalse;
  }
  else {
    map(in_stack_fffffffffffffb50,
        (ProKey *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    ProKey::operator=((ProKey *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                      (ProKey *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    values(in_stack_fffffffffffffb68,(ProKey *)in_stack_fffffffffffffb60);
    ProStringList::operator=
              ((ProStringList *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
               (ProStringList *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    ProStringList::~ProStringList((ProStringList *)0x2f528f);
LAB_002f528f:
    local_158[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_158[0].d.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_158[0].d.size = -0x5555555555555556;
    values(in_stack_fffffffffffffb68,(ProKey *)in_stack_fffffffffffffb60);
    bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x2f52f3);
    if (bVar1) {
      bVar1 = ProString::operator==(in_stack_fffffffffffffb60,&in_stack_fffffffffffffb58->m_string);
      if (bVar1) {
        bVar2 = true;
      }
      else {
        local_168 = 0xaaaaaaaaaaaaaaaa;
        psStack_160 = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
        QStringView::QStringView<QString,_true>
                  ((QStringView *)in_stack_fffffffffffffb50,
                   (QString *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
        QVar8 = QStringView::mid((QStringView *)in_stack_fffffffffffffb58,
                                 (qsizetype)in_stack_fffffffffffffb68,
                                 (qsizetype)in_stack_fffffffffffffb60);
        local_3e8 = QVar8.m_size;
        local_3e0 = QVar8.m_data;
        local_168 = local_3e8;
        psStack_160 = local_3e0;
        QStringView::QStringView<QString,_true>
                  ((QStringView *)in_stack_fffffffffffffb50,
                   (QString *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
        QVar8.m_data = in_stack_fffffffffffffb78;
        QVar8.m_size = (qsizetype)in_stack_fffffffffffffb70;
        qVar6 = QStringView::indexOf
                          ((QStringView *)
                           CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),QVar8,
                           CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                           in_stack_fffffffffffffb3c);
        iVar4 = (int)qVar6;
        if (iVar4 != -1) {
          local_179 = 0xaa;
          local_190 = QStringView::left((QStringView *)in_stack_fffffffffffffb58,
                                        (qsizetype)in_stack_fffffffffffffb50);
          local_468 = QStringView::toInt((QStringView *)
                                         CONCAT44(in_stack_fffffffffffffb4c,
                                                  in_stack_fffffffffffffb48),
                                         (bool *)CONCAT44(in_stack_fffffffffffffb44,
                                                          in_stack_fffffffffffffb40),
                                         in_stack_fffffffffffffb3c);
          if ((local_179 & 1) != 0) {
            local_1a0 = QStringView::mid((QStringView *)in_stack_fffffffffffffb58,
                                         (qsizetype)in_stack_fffffffffffffb68,
                                         (qsizetype)in_stack_fffffffffffffb60);
            iVar5 = QStringView::toInt((QStringView *)
                                       CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48)
                                       ,(bool *)CONCAT44(in_stack_fffffffffffffb44,
                                                         in_stack_fffffffffffffb40),
                                       in_stack_fffffffffffffb3c);
            if ((local_179 & 1) != 0) {
              local_1a4 = iVar5 - local_468;
              qAbs<int>(&local_1a4);
              QList<ProString>::reserve
                        ((QList<ProString> *)in_stack_fffffffffffffb68,CONCAT44(iVar4,local_468));
              local_464 = local_468;
              if (local_468 < iVar5) {
                for (; local_464 <= iVar5; local_464 = local_464 + 1) {
                  QString::number((int)local_1f0,local_464);
                  ProString::ProString
                            ((ProString *)
                             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
                  ProStringList::operator<<
                            ((ProStringList *)
                             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                             (ProString *)
                             CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
                  ProString::~ProString((ProString *)0x2f5550);
                  QString::~QString((QString *)0x2f555d);
                }
              }
              else {
                for (; iVar5 <= local_468; local_468 = local_468 + -1) {
                  QString::number((int)local_238,local_468);
                  ProString::ProString
                            ((ProString *)
                             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
                  ProStringList::operator<<
                            ((ProStringList *)
                             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                             (ProString *)
                             CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
                  ProString::~ProString((ProString *)0x2f55cb);
                  QString::~QString((QString *)0x2f55d8);
                }
              }
            }
          }
        }
      }
    }
    if (bVar2) {
      if (in_RDI->m_debugLevel != 0) {
        in_stack_fffffffffffffb70 = &local_70;
        QStringView::QStringView<QString,_true>
                  ((QStringView *)in_stack_fffffffffffffb50,
                   (QString *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
        QVar8 = QStringView::mid((QStringView *)in_stack_fffffffffffffb58,
                                 (qsizetype)in_stack_fffffffffffffb68,
                                 (qsizetype)in_stack_fffffffffffffb60);
        local_260 = QVar8.m_size;
        local_258 = QVar8.m_data;
        QStringView::toLocal8Bit
                  ((QStringView *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        pcVar7 = QByteArray::constData((QByteArray *)0x2f56b7);
        traceMsgInternal(in_RDI,"entering infinite loop for %s",pcVar7);
        QByteArray::~QByteArray((QByteArray *)0x2f56da);
      }
    }
    else if (in_RDI->m_debugLevel != 0) {
      in_stack_fffffffffffffb58 = &local_70;
      n = local_38;
      QStringView::QStringView<QString,_true>
                ((QStringView *)in_stack_fffffffffffffb50,
                 (QString *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
      QVar8 = QStringView::mid((QStringView *)in_stack_fffffffffffffb58,
                               (qsizetype)in_stack_fffffffffffffb68,(qsizetype)n);
      local_418 = QVar8.m_size;
      local_410 = QVar8.m_data;
      local_288 = local_418;
      local_280 = local_410;
      QStringView::toLocal8Bit
                ((QStringView *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      in_stack_fffffffffffffb68 = (QMakeEvaluator *)QByteArray::constData((QByteArray *)0x2f5797);
      formatValueList((ProStringList *)in_stack_fffffffffffffb58,
                      SUB81((ulong)in_stack_fffffffffffffb50 >> 0x38,0));
      QtPrivate::asString(local_2b8);
      QString::toLocal8Bit(&in_stack_fffffffffffffb58->m_string);
      pcVar7 = QByteArray::constData((QByteArray *)0x2f57dd);
      traceMsgInternal(in_RDI,"entering loop for %s over %s",in_stack_fffffffffffffb68,pcVar7);
      QByteArray::~QByteArray((QByteArray *)0x2f5805);
      QString::~QString((QString *)0x2f5812);
      QByteArray::~QByteArray((QByteArray *)0x2f581f);
    }
LAB_002f5823:
    do {
      if (bVar2) {
        bVar1 = ProString::isEmpty(&local_70);
        if (!bVar1) {
          QString::number((int)local_318,local_44c);
          ProString::ProString
                    ((ProString *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     (QString *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          ProStringList::ProStringList
                    ((ProStringList *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     (ProString *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          ProValueMapStack::top((ProValueMapStack *)0x2f5897);
          QMap<ProKey,_ProStringList>::operator[]
                    ((QMap<ProKey,_ProStringList> *)in_stack_fffffffffffffb70,
                     (ProKey *)in_stack_fffffffffffffb68);
          ProStringList::operator=
                    ((ProStringList *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     (ProStringList *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38))
          ;
          ProStringList::~ProStringList((ProStringList *)0x2f58c4);
          ProString::~ProString((ProString *)0x2f58d1);
          QString::~QString((QString *)0x2f58de);
        }
        local_44c = local_44c + 1;
        if (1000 < (int)local_44c) {
          QByteArrayView::QByteArrayView<44ul>
                    ((QByteArrayView *)in_stack_fffffffffffffb50,
                     (char (*) [44])CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
          QVar10.m_data = local_340;
          QVar10.m_size = (qsizetype)local_330;
          QString::fromLatin1(QVar10);
          evalError((QMakeEvaluator *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                    (QString *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          QString::~QString((QString *)0x2f5940);
          goto LAB_002f5b6e;
        }
        if (in_RDI->m_debugLevel != 0) {
          traceMsgInternal(in_RDI,"loop iteration %d",(ulong)local_44c);
        }
      }
      else {
        memset(&local_370,0xaa,0x30);
        ProString::ProString
                  ((ProString *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
        do {
          in_stack_fffffffffffffb50 = (QMakeEvaluator *)(long)(int)local_44c;
          qVar6 = QList<ProString>::size(local_158);
          if (qVar6 <= (long)in_stack_fffffffffffffb50) {
            local_450 = 0xc;
            goto LAB_002f5add;
          }
          local_44c = local_44c + 1;
          QList<ProString>::at
                    ((QList<ProString> *)
                     CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          ProString::operator=
                    ((ProString *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                     (ProString *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
          bVar1 = ProString::isEmpty(&local_370);
        } while (bVar1);
        if (in_RDI->m_debugLevel != 0) {
          formatValue(in_stack_fffffffffffffb70,SUB81((ulong)in_stack_fffffffffffffb68 >> 0x38,0));
          QtPrivate::asString((QString *)&stack0xfffffffffffffc60);
          QString::toLocal8Bit(&in_stack_fffffffffffffb58->m_string);
          pcVar7 = QByteArray::constData((QByteArray *)0x2f5a52);
          traceMsgInternal(in_RDI,"loop iteration %s",pcVar7);
          QByteArray::~QByteArray((QByteArray *)0x2f5a75);
          QString::~QString((QString *)0x2f5a82);
        }
        ProStringList::ProStringList
                  ((ProStringList *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                   (ProString *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
        ProValueMapStack::top((ProValueMapStack *)0x2f5aa8);
        QMap<ProKey,_ProStringList>::operator[]
                  ((QMap<ProKey,_ProStringList> *)in_stack_fffffffffffffb70,
                   (ProKey *)in_stack_fffffffffffffb68);
        ProStringList::operator=
                  ((ProStringList *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                   (ProStringList *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
        ProStringList::~ProStringList((ProStringList *)0x2f5ad5);
        local_450 = 0;
LAB_002f5add:
        ProString::~ProString((ProString *)0x2f5aea);
        if (local_450 != 0) {
          if (local_450 != 0xc) goto LAB_002f5be6;
          goto LAB_002f5b6e;
        }
        in_stack_fffffffffffffb4c = 0;
      }
      in_stack_fffffffffffffb48 = visitProBlock(in_stack_fffffffffffffc68,tokPtr_00);
      local_444 = in_stack_fffffffffffffb48;
    } while (in_stack_fffffffffffffb48 < ReturnError);
    if (in_stack_fffffffffffffb48 != ReturnBreak) {
      if (in_stack_fffffffffffffb48 != ReturnNext) goto LAB_002f5b6e;
      local_444 = ReturnTrue;
      goto LAB_002f5823;
    }
    local_444 = ReturnTrue;
LAB_002f5b6e:
    if (in_RDI->m_debugLevel != 0) {
      traceMsgInternal(in_RDI,"done looping");
    }
    bVar2 = ProString::isEmpty(&local_70);
    if (!bVar2) {
      ProValueMapStack::top((ProValueMapStack *)0x2f5bb0);
      QMap<ProKey,_ProStringList>::operator[]
                ((QMap<ProKey,_ProStringList> *)in_stack_fffffffffffffb70,
                 (ProKey *)in_stack_fffffffffffffb68);
      ProStringList::operator=
                ((ProStringList *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 (ProStringList *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    }
    local_424 = local_444;
LAB_002f5be6:
    ProStringList::~ProStringList((ProStringList *)0x2f5bf3);
  }
  ProString::~ProString((ProString *)0x2f5c00);
LAB_002f5c00:
  ProStringList::~ProStringList((ProStringList *)0x2f5c0d);
  ProStringList::~ProStringList((ProStringList *)0x2f5c1a);
  ProKey::~ProKey((ProKey *)0x2f5c27);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_424;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::visitProLoop(
        const ProKey &_variable, const ushort *exprPtr, const ushort *tokPtr)
{
    VisitReturn ret = ReturnTrue;
    bool infinite = false;
    int index = 0;
    ProKey variable;
    ProStringList oldVarVal;
    ProStringList it_list_out;
    if (expandVariableReferences(exprPtr, 0, &it_list_out, true) == ReturnError)
        return ReturnError;
    ProString it_list = it_list_out.at(0);
    if (_variable.isEmpty()) {
        if (it_list != statics.strever) {
            evalError(fL1S("Invalid loop expression."));
            return ReturnFalse;
        }
        it_list = ProString(statics.strforever);
    } else {
        variable = map(_variable);
        oldVarVal = values(variable);
    }
    ProStringList list = values(it_list.toKey());
    if (list.isEmpty()) {
        if (it_list == statics.strforever) {
            if (m_cumulative) {
                // The termination conditions wouldn't be evaluated, so we must skip it.
                traceMsg("skipping forever loop in cumulative mode");
                return ReturnFalse;
            }
            infinite = true;
        } else {
            QStringView itl = it_list.toQStringView();
            int dotdot = itl.indexOf(statics.strDotDot);
            if (dotdot != -1) {
                bool ok;
                int start = itl.left(dotdot).toInt(&ok);
                if (ok) {
                    int end = itl.mid(dotdot+2).toInt(&ok);
                    if (ok) {
                        const int absDiff = qAbs(end - start);
                        if (m_cumulative && absDiff > 100) {
                            // Such a loop is unlikely to contribute something useful to the
                            // file collection, and may cause considerable delay.
                            traceMsg("skipping excessive loop in cumulative mode");
                            return ReturnFalse;
                        }
                        list.reserve(absDiff + 1);
                        if (start < end) {
                            for (int i = start; i <= end; i++)
                                list << ProString(QString::number(i));
                        } else {
                            for (int i = start; i >= end; i--)
                                list << ProString(QString::number(i));
                        }
                    }
                }
            }
        }
    }

    if (infinite)
        traceMsg("entering infinite loop for %s", dbgKey(variable));
    else
        traceMsg("entering loop for %s over %s", dbgKey(variable), dbgStrList(list));

    forever {
        if (infinite) {
            if (!variable.isEmpty())
                m_valuemapStack.top()[variable] = ProStringList(ProString(QString::number(index)));
            if (++index > 1000) {
                evalError(fL1S("Ran into infinite loop (> 1000 iterations)."));
                break;
            }
            traceMsg("loop iteration %d", index);
        } else {
            ProString val;
            do {
                if (index >= list.size())
                    goto do_break;
                val = list.at(index++);
            } while (val.isEmpty()); // stupid, but qmake is like that
            traceMsg("loop iteration %s", dbgStr(val));
            m_valuemapStack.top()[variable] = ProStringList(val);
        }

        ret = visitProBlock(tokPtr);
        switch (ret) {
        case ReturnTrue:
        case ReturnFalse:
            break;
        case ReturnNext:
            ret = ReturnTrue;
            break;
        case ReturnBreak:
            ret = ReturnTrue;
            goto do_break;
        default:
            goto do_break;
        }
    }